

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-generated-function-mockers.h
# Opt level: O0

MockSpec<int_(int,_int)> * __thiscall
testing::internal::FunctionMocker<int_(int,_int)>::With
          (FunctionMocker<int_(int,_int)> *this,Matcher<int> *m1,Matcher<int> *m2)

{
  MockSpec<int_(int,_int)> *pMVar1;
  tuple<testing::Matcher<int>,_testing::Matcher<int>_> local_50;
  Matcher<int> *local_20;
  Matcher<int> *m2_local;
  Matcher<int> *m1_local;
  FunctionMocker<int_(int,_int)> *this_local;
  
  local_20 = m2;
  m2_local = m1;
  m1_local = (Matcher<int> *)this;
  pMVar1 = FunctionMockerBase<int_(int,_int)>::current_spec
                     (&this->super_FunctionMockerBase<int_(int,_int)>);
  std::make_tuple<testing::Matcher<int>const&,testing::Matcher<int>const&>
            (&local_50,m2_local,local_20);
  MockSpec<int_(int,_int)>::SetMatchers(pMVar1,&local_50);
  std::tuple<testing::Matcher<int>,_testing::Matcher<int>_>::~tuple(&local_50);
  pMVar1 = FunctionMockerBase<int_(int,_int)>::current_spec
                     (&this->super_FunctionMockerBase<int_(int,_int)>);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2) {
    this->current_spec().SetMatchers(::testing::make_tuple(m1, m2));
    return this->current_spec();
  }